

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,RegSlot instance,uint32 slotId)

{
  bool bVar1;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
      (local_a = (undefined1)value, value < 0x100)) &&
     ((local_9 = (undefined1)instance, instance < 0x100 &&
      (local_b = (undefined1)slotId, slotId < 0x100)))) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_b,3,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmSlot(OpCodeAsmJs op, RegSlot value, RegSlot instance, uint32 slotId)
    {
        OpLayoutT_ElementSlot<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.SlotIndex, slotId))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }